

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O3

int32 __thiscall TTD::TextFormatReader::ReadNakedInt32(TextFormatReader *this,bool readSeparator)

{
  ParseTokenKind PVar1;
  int64 iVar2;
  undefined7 in_register_00000031;
  TextFormatReader *this_00;
  
  (*(this->super_FileReader)._vptr_FileReader[2])(this,CONCAT71(in_register_00000031,readSeparator))
  ;
  this_00 = this;
  PVar1 = Scan(this,&this->m_charListOpt);
  if (PVar1 == Number) {
    iVar2 = ReadIntFromCharArray
                      (this_00,(this->m_charListOpt).
                               super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>.
                               buffer);
    if ((int)iVar2 == iVar2) {
      return (int)iVar2;
    }
  }
  TTDAbort_unrecoverable_error("Error in parse.");
}

Assistant:

int32 TextFormatReader::ReadNakedInt32(bool readSeparator)
    {
        this->ReadSeparator(readSeparator);

        NSTokens::ParseTokenKind tok = this->Scan(this->m_charListOpt);
        TTDAssert(tok == NSTokens::ParseTokenKind::Number, "Error in parse.");

        int64 ival = this->ReadIntFromCharArray(this->m_charListOpt.GetBuffer());
        TTDAssert(INT32_MIN <= ival && ival <= INT32_MAX, "Error in parse.");

        return (int32)ival;
    }